

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void ures_appendResPath(UResourceBundle *resB,char *toAdd,int32_t lenToAdd,UErrorCode *status)

{
  int iVar1;
  char *pcVar2;
  char *temp;
  int32_t resPathLenOrig;
  UErrorCode *status_local;
  int32_t lenToAdd_local;
  char *toAdd_local;
  UResourceBundle *resB_local;
  
  iVar1 = resB->fResPathLen;
  if (resB->fResPath == (char *)0x0) {
    resB->fResPath = resB->fResBuf;
    *resB->fResPath = '\0';
    resB->fResPathLen = 0;
  }
  resB->fResPathLen = lenToAdd + resB->fResPathLen;
  if (0x3f < resB->fResPathLen + 1) {
    if (resB->fResPath == resB->fResBuf) {
      pcVar2 = (char *)uprv_malloc_63((long)(resB->fResPathLen + 1));
      resB->fResPath = pcVar2;
      if (resB->fResPath == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      strcpy(resB->fResPath,resB->fResBuf);
    }
    else {
      pcVar2 = (char *)uprv_realloc_63(resB->fResPath,(long)(resB->fResPathLen + 1));
      if (pcVar2 == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return;
      }
      resB->fResPath = pcVar2;
    }
  }
  strcpy(resB->fResPath + iVar1,toAdd);
  return;
}

Assistant:

static void ures_appendResPath(UResourceBundle *resB, const char* toAdd, int32_t lenToAdd, UErrorCode *status) {
    int32_t resPathLenOrig = resB->fResPathLen;
    if(resB->fResPath == NULL) {
        resB->fResPath = resB->fResBuf;
        *(resB->fResPath) = 0;
        resB->fResPathLen = 0;
    } 
    resB->fResPathLen += lenToAdd;
    if(RES_BUFSIZE <= resB->fResPathLen+1) {
        if(resB->fResPath == resB->fResBuf) {
            resB->fResPath = (char *)uprv_malloc((resB->fResPathLen+1)*sizeof(char));
            /* Check that memory was allocated correctly. */
            if (resB->fResPath == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            uprv_strcpy(resB->fResPath, resB->fResBuf);
        } else {
            char *temp = (char *)uprv_realloc(resB->fResPath, (resB->fResPathLen+1)*sizeof(char));
            /* Check that memory was reallocated correctly. */
            if (temp == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            resB->fResPath = temp;
        }
    }
    uprv_strcpy(resB->fResPath + resPathLenOrig, toAdd);
}